

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

void __thiscall QByteArray::clear(QByteArray *this)

{
  QArrayDataPointer<char>::clear(&this->d);
  return;
}

Assistant:

void QByteArray::clear()
{
    d.clear();
}